

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcItemWidth(void)

{
  ImVec2 IVar1;
  float region_avail_x;
  float w;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_20;
  float local_14;
  
  if (((GImGui->NextItemData).Flags & 1U) == 0) {
    local_14 = (GImGui->CurrentWindow->DC).ItemWidth;
  }
  else {
    local_14 = (GImGui->NextItemData).Width;
  }
  if (local_14 < 0.0) {
    IVar1 = GetContentRegionAvail();
    local_20 = IVar1.x;
    local_14 = ImMax<float>(1.0,local_20 + local_14);
  }
  return (float)(int)local_14;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_avail_x = GetContentRegionAvail().x;
        w = ImMax(1.0f, region_avail_x + w);
    }
    w = IM_TRUNC(w);
    return w;
}